

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::Formatter::make_footer_abi_cxx11_(Formatter *this,App *app)

{
  ulong uVar1;
  App *in_RDX;
  string *in_RDI;
  string footer;
  string *__lhs;
  string local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char in_stack_ffffffffffffffbf;
  string local_38 [32];
  
  __lhs = in_RDI;
  App::get_footer_abi_cxx11_(in_RDX);
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ::std::operator+(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb0);
    ::std::operator+(__lhs,(char *)in_RDI);
    ::std::__cxx11::string::~string(local_60);
  }
  else {
    ::std::__cxx11::string::string((string *)in_RDI);
  }
  ::std::__cxx11::string::~string(local_38);
  return __lhs;
}

Assistant:

CLI11_INLINE std::string Formatter::make_footer(const App *app) const {
    std::string footer = app->get_footer();
    if(footer.empty()) {
        return std::string{};
    }
    return '\n' + footer + "\n\n";
}